

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_too_many_filters.c
# Opt level: O2

void test_read_too_many_filters(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *a;
  
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_too_many_filters.c"
                   ,L'!',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_gzip((archive *)a);
  if (iVar1 == -0x14) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_too_many_filters.c"
                   ,L'$');
    test_skipping("gzip reading not fully supported on this platform");
  }
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_too_many_filters.c"
                      ,L'&',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  extract_reference_file("test_read_too_many_filters.gz");
  wVar2 = archive_read_open_filename(a,"test_read_too_many_filters.gz",200);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_too_many_filters.c"
                      ,L')',-0x1e,"ARCHIVE_FATAL",(long)wVar2,
                      "archive_read_open_filename(a, name, 200)",a);
  archive_read_close((archive *)a);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_too_many_filters.c"
                      ,L'0',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_too_many_filters)
{
	const char *name = "test_read_too_many_filters.gz";
	struct archive *a;
	int r;

	assert((a = archive_read_new()) != NULL);
	r = archive_read_support_filter_gzip(a);
	if (r == ARCHIVE_WARN) {
		skipping("gzip reading not fully supported on this platform");
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_FATAL,
	    archive_read_open_filename(a, name, 200));

	// Can't assert the return value here:
	//  = Decompressing via zlib will return ARCHIVE_OK
	//  = Decompressing via external gzip will return ARCHIVE_WARN
	//    (Due to a dirty shutdown of the gzip program.)
	archive_read_close(a);
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}